

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderAtomicOpTests.cpp
# Opt level: O3

IterateResult __thiscall
deqp::gles31::Functional::ShaderAtomicOpCase::iterate(ShaderAtomicOpCase *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  GLuint program;
  int iVar3;
  GLuint GVar4;
  deUint32 dVar5;
  GLenum GVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ObjectTraits *traits;
  void *pvVar7;
  TestError *pTVar8;
  uint uVar9;
  char *description;
  uint uVar10;
  allocator_type local_199;
  vector<unsigned_char,_std::allocator<unsigned_char>_> bufData;
  Buffer inoutBuffer;
  InterfaceVariableInfo inVarInfo;
  InterfaceVariableInfo groupVarInfo;
  InterfaceVariableInfo outVarInfo;
  InterfaceBlockInfo blockInfo;
  Functions *gl;
  
  iVar3 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  gl = (Functions *)CONCAT44(extraout_var,iVar3);
  program = (this->m_program->m_program).m_program;
  iVar3 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  traits = glu::objectTraits(OBJECTTYPE_BUFFER);
  glu::ObjectWrapper::ObjectWrapper
            (&inoutBuffer.super_ObjectWrapper,(Functions *)CONCAT44(extraout_var_00,iVar3),traits);
  GVar4 = (*gl->getProgramResourceIndex)(program,0x92e6,"InOut");
  paVar1 = &blockInfo.name.field_2;
  blockInfo.name._M_string_length = 0;
  blockInfo.name.field_2._M_local_buf[0] = '\0';
  blockInfo.index = 0xffffffff;
  blockInfo.bufferBinding = 0;
  blockInfo.dataSize = 0;
  blockInfo.activeVariables.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  blockInfo.activeVariables.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  blockInfo.activeVariables.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  blockInfo.name._M_dataplus._M_p = (pointer)paVar1;
  glu::getProgramInterfaceBlockInfo(gl,program,0x92e6,GVar4,&blockInfo);
  GVar4 = (*gl->getProgramResourceIndex)(program,0x92e5,"InOut.inputValues[0]");
  inVarInfo.name._M_dataplus._M_p = (pointer)&inVarInfo.name.field_2;
  inVarInfo.name._M_string_length = 0;
  inVarInfo.name.field_2._M_local_buf[0] = '\0';
  inVarInfo.index = 0xffffffff;
  inVarInfo.blockIndex = 0xffffffff;
  inVarInfo.atomicCounterBufferIndex = 0xffffffff;
  inVarInfo.type = 0;
  inVarInfo.arraySize = 0;
  inVarInfo.offset = 0;
  inVarInfo.arrayStride = 0;
  inVarInfo._60_5_ = 0;
  inVarInfo._65_8_ = 0;
  glu::getProgramInterfaceVariableInfo(gl,program,0x92e5,GVar4,&inVarInfo);
  GVar4 = (*gl->getProgramResourceIndex)(program,0x92e5,"InOut.outputValues[0]");
  outVarInfo.name._M_dataplus._M_p = (pointer)&outVarInfo.name.field_2;
  outVarInfo.name._M_string_length = 0;
  outVarInfo.name.field_2._M_local_buf[0] = '\0';
  outVarInfo.index = 0xffffffff;
  outVarInfo.blockIndex = 0xffffffff;
  outVarInfo.atomicCounterBufferIndex = 0xffffffff;
  outVarInfo.type = 0;
  outVarInfo.arraySize = 0;
  outVarInfo.offset = 0;
  outVarInfo.arrayStride = 0;
  outVarInfo._60_5_ = 0;
  outVarInfo._65_8_ = 0;
  glu::getProgramInterfaceVariableInfo(gl,program,0x92e5,GVar4,&outVarInfo);
  GVar4 = (*gl->getProgramResourceIndex)(program,0x92e5,"InOut.groupValues[0]");
  paVar2 = &groupVarInfo.name.field_2;
  groupVarInfo.name._M_string_length = 0;
  groupVarInfo.name.field_2._M_local_buf[0] = '\0';
  groupVarInfo.index = 0xffffffff;
  groupVarInfo.blockIndex = 0xffffffff;
  groupVarInfo.atomicCounterBufferIndex = 0xffffffff;
  groupVarInfo.type = 0;
  groupVarInfo.arraySize = 0;
  groupVarInfo.offset = 0;
  groupVarInfo.arrayStride = 0;
  groupVarInfo._60_5_ = 0;
  groupVarInfo._65_8_ = 0;
  groupVarInfo.name._M_dataplus._M_p = (pointer)paVar2;
  glu::getProgramInterfaceVariableInfo(gl,program,0x92e5,GVar4,&groupVarInfo);
  dVar5 = (this->m_numWorkGroups).m_data[1] * (this->m_numWorkGroups).m_data[0] *
          (this->m_numWorkGroups).m_data[2];
  uVar10 = (this->m_workGroupSize).m_data[1] * (this->m_workGroupSize).m_data[0] *
           (this->m_workGroupSize).m_data[2] * dVar5;
  if (((inVarInfo.arraySize != uVar10) || (outVarInfo.arraySize != uVar10)) ||
     (groupVarInfo.arraySize != dVar5)) {
    pTVar8 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar8,(char *)0x0,
               "inVarInfo.arraySize == numValues && outVarInfo.arraySize == numValues && groupVarInfo.arraySize == product(m_numWorkGroups)"
               ,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fShaderAtomicOpTests.cpp"
               ,0xcf);
    __cxa_throw(pTVar8,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  (*gl->useProgram)(program);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&bufData,(ulong)blockInfo.dataSize,&local_199);
  if (bufData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start !=
      bufData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    memset(bufData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start,0,
           (long)bufData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)bufData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_start);
  }
  (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[5])
            (this,(ulong)uVar10,(ulong)(uint)inVarInfo.arrayStride,
             bufData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start + inVarInfo.offset);
  if ((this->m_operandType == ATOMIC_OPERAND_BUFFER_VARIABLE) &&
     ((this->m_numWorkGroups).m_data[1] * (this->m_numWorkGroups).m_data[0] *
      (this->m_numWorkGroups).m_data[2] != 0)) {
    dVar5 = this->m_initialValue;
    uVar9 = 0;
    do {
      *(deUint32 *)
       (bufData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start +
       (ulong)(groupVarInfo.arrayStride * uVar9) + (ulong)groupVarInfo.offset) = dVar5;
      uVar9 = uVar9 + 1;
    } while (uVar9 < (this->m_numWorkGroups).m_data[1] * (this->m_numWorkGroups).m_data[0] *
                     (this->m_numWorkGroups).m_data[2]);
  }
  (*gl->bindBuffer)(0x90d2,inoutBuffer.super_ObjectWrapper.m_object);
  (*gl->bufferData)(0x90d2,(ulong)blockInfo.dataSize,
                    bufData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,0x88e5);
  (*gl->bindBufferBase)(0x90d2,0,inoutBuffer.super_ObjectWrapper.m_object);
  GVar6 = (*gl->getError)();
  glu::checkError(GVar6,"Output buffer setup failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fShaderAtomicOpTests.cpp"
                  ,0xe3);
  if (bufData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(bufData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)bufData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)bufData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  (*gl->dispatchCompute)
            ((this->m_numWorkGroups).m_data[0],(this->m_numWorkGroups).m_data[1],
             (this->m_numWorkGroups).m_data[2]);
  pvVar7 = (*gl->mapBufferRange)(0x90d2,0,(ulong)blockInfo.dataSize,1);
  GVar6 = (*gl->getError)();
  glu::checkError(GVar6,"glMapBufferRange()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fShaderAtomicOpTests.cpp"
                  ,0xed);
  if (pvVar7 != (void *)0x0) {
    iVar3 = (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[6])
                      (this,(ulong)uVar10,(ulong)(uint)inVarInfo.arrayStride,
                       (ulong)inVarInfo.offset + (long)pvVar7,(ulong)(uint)outVarInfo.arrayStride,
                       (ulong)outVarInfo.offset + (long)pvVar7,(ulong)(uint)groupVarInfo.arrayStride
                       ,(ulong)groupVarInfo.offset + (long)pvVar7);
    (*gl->unmapBuffer)(0x90d2);
    GVar6 = (*gl->getError)();
    glu::checkError(GVar6,"glUnmapBuffer()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fShaderAtomicOpTests.cpp"
                    ,0xf6);
    description = "Comparison failed";
    if ((byte)iVar3 != 0) {
      description = "Pass";
    }
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
               (uint)(byte)((byte)iVar3 ^ 1),description);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)groupVarInfo.name._M_dataplus._M_p != paVar2) {
      operator_delete(groupVarInfo.name._M_dataplus._M_p,
                      CONCAT71(groupVarInfo.name.field_2._M_allocated_capacity._1_7_,
                               groupVarInfo.name.field_2._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)outVarInfo.name._M_dataplus._M_p != &outVarInfo.name.field_2) {
      operator_delete(outVarInfo.name._M_dataplus._M_p,
                      CONCAT71(outVarInfo.name.field_2._M_allocated_capacity._1_7_,
                               outVarInfo.name.field_2._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)inVarInfo.name._M_dataplus._M_p != &inVarInfo.name.field_2) {
      operator_delete(inVarInfo.name._M_dataplus._M_p,
                      CONCAT71(inVarInfo.name.field_2._M_allocated_capacity._1_7_,
                               inVarInfo.name.field_2._M_local_buf[0]) + 1);
    }
    if (blockInfo.activeVariables.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(blockInfo.activeVariables.super__Vector_base<int,_std::allocator<int>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)blockInfo.activeVariables.super__Vector_base<int,_std::allocator<int>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)blockInfo.activeVariables.super__Vector_base<int,_std::allocator<int>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)blockInfo.name._M_dataplus._M_p != paVar1) {
      operator_delete(blockInfo.name._M_dataplus._M_p,
                      CONCAT71(blockInfo.name.field_2._M_allocated_capacity._1_7_,
                               blockInfo.name.field_2._M_local_buf[0]) + 1);
    }
    glu::ObjectWrapper::~ObjectWrapper(&inoutBuffer.super_ObjectWrapper);
    return STOP;
  }
  pTVar8 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (pTVar8,(char *)0x0,"resPtr",
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fShaderAtomicOpTests.cpp"
             ,0xee);
  __cxa_throw(pTVar8,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

ShaderAtomicOpCase::IterateResult ShaderAtomicOpCase::iterate (void)
{
	const glw::Functions&		gl				= m_context.getRenderContext().getFunctions();
	const deUint32				program			= m_program->getProgram();
	const Buffer				inoutBuffer		(m_context.getRenderContext());
	const deUint32				blockNdx		= gl.getProgramResourceIndex(program, GL_SHADER_STORAGE_BLOCK, "InOut");
	const InterfaceBlockInfo	blockInfo		= getProgramInterfaceBlockInfo(gl, program, GL_SHADER_STORAGE_BLOCK, blockNdx);
	const deUint32				inVarNdx		= gl.getProgramResourceIndex(program, GL_BUFFER_VARIABLE, "InOut.inputValues[0]");
	const InterfaceVariableInfo	inVarInfo		= getProgramInterfaceVariableInfo(gl, program, GL_BUFFER_VARIABLE, inVarNdx);
	const deUint32				outVarNdx		= gl.getProgramResourceIndex(program, GL_BUFFER_VARIABLE, "InOut.outputValues[0]");
	const InterfaceVariableInfo	outVarInfo		= getProgramInterfaceVariableInfo(gl, program, GL_BUFFER_VARIABLE, outVarNdx);
	const deUint32				groupVarNdx		= gl.getProgramResourceIndex(program, GL_BUFFER_VARIABLE, "InOut.groupValues[0]");
	const InterfaceVariableInfo	groupVarInfo	= getProgramInterfaceVariableInfo(gl, program, GL_BUFFER_VARIABLE, groupVarNdx);
	const deUint32				numValues		= product(m_workGroupSize)*product(m_numWorkGroups);

	TCU_CHECK(inVarInfo.arraySize == numValues &&
			  outVarInfo.arraySize == numValues &&
			  groupVarInfo.arraySize == product(m_numWorkGroups));

	gl.useProgram(program);

	// Setup buffer.
	{
		vector<deUint8> bufData(blockInfo.dataSize);
		std::fill(bufData.begin(), bufData.end(), 0);

		getInputs((int)numValues, (int)inVarInfo.arrayStride, &bufData[0] + inVarInfo.offset);

		if (m_operandType == ATOMIC_OPERAND_BUFFER_VARIABLE)
		{
			for (deUint32 valNdx = 0; valNdx < product(m_numWorkGroups); valNdx++)
				*(deUint32*)(&bufData[0] + groupVarInfo.offset + groupVarInfo.arrayStride*valNdx) = m_initialValue;
		}

		gl.bindBuffer(GL_SHADER_STORAGE_BUFFER, *inoutBuffer);
		gl.bufferData(GL_SHADER_STORAGE_BUFFER, blockInfo.dataSize, &bufData[0], GL_STATIC_READ);
		gl.bindBufferBase(GL_SHADER_STORAGE_BUFFER, 0, *inoutBuffer);
		GLU_EXPECT_NO_ERROR(gl.getError(), "Output buffer setup failed");
	}

	gl.dispatchCompute(m_numWorkGroups.x(), m_numWorkGroups.y(), m_numWorkGroups.z());

	// Read back and compare
	{
		const void*		resPtr		= gl.mapBufferRange(GL_SHADER_STORAGE_BUFFER, 0, blockInfo.dataSize, GL_MAP_READ_BIT);
		bool			isOk		= true;

		GLU_EXPECT_NO_ERROR(gl.getError(), "glMapBufferRange()");
		TCU_CHECK(resPtr);

		isOk = verify((int)numValues,
					  (int)inVarInfo.arrayStride, (const deUint8*)resPtr + inVarInfo.offset,
					  (int)outVarInfo.arrayStride, (const deUint8*)resPtr + outVarInfo.offset,
					  (int)groupVarInfo.arrayStride, (const deUint8*)resPtr + groupVarInfo.offset);

		gl.unmapBuffer(GL_SHADER_STORAGE_BUFFER);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glUnmapBuffer()");

		m_testCtx.setTestResult(isOk ? QP_TEST_RESULT_PASS	: QP_TEST_RESULT_FAIL,
								isOk ? "Pass"				: "Comparison failed");
	}

	return STOP;
}